

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O1

Float __thiscall pbrt::GaussianFilter::Evaluate(GaussianFilter *this,Point2f *p)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar7 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  fVar2 = (p->super_Tuple2<pbrt::Point2,_float>).x;
  fVar3 = this->sigma;
  fVar4 = fVar3 * fVar3 * 6.2831855;
  if (fVar4 < 0.0) {
    auVar9._0_4_ = sqrtf(fVar4);
    auVar9._4_60_ = extraout_var;
    auVar7 = auVar9._0_16_;
  }
  else {
    auVar7 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  }
  auVar12 = ZEXT816(0) << 0x40;
  fVar2 = ((fVar2 * fVar2) / (fVar3 * (fVar3 + fVar3))) * -1.442695;
  auVar5 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  fVar2 = fVar2 - auVar5._0_4_;
  auVar8 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3e679a0b),0),ZEXT416((uint)fVar2),
                           SUB6416(ZEXT464(0x3da00ac9),0));
  auVar8 = vfmadd213ss_fma(auVar8,ZEXT416((uint)fVar2),ZEXT416(0x3f321004));
  auVar8 = vfmadd213ss_fma(auVar8,ZEXT416((uint)fVar2),ZEXT416(0x3f800000));
  iVar1 = (int)auVar5._0_4_ + -0x7f + (auVar8._0_4_ >> 0x17);
  if (-0x7f < iVar1) {
    if (iVar1 < 0x80) {
      auVar12 = ZEXT416(iVar1 * 0x800000 + 0x3f800000U | auVar8._0_4_ & 0x807fffff);
    }
    else {
      auVar12 = SUB6416(ZEXT464(0x7f800000),0);
    }
  }
  auVar5._0_4_ = this->expX;
  auVar5._4_4_ = this->expY;
  auVar5._8_4_ = *(undefined4 *)&this->field_0x14;
  auVar5._12_4_ = (this->sampler).domain.pMin.super_Tuple2<pbrt::Point2,_float>.x;
  fVar2 = (p->super_Tuple2<pbrt::Point2,_float>).y;
  fVar3 = this->sigma;
  fVar4 = fVar3 * fVar3 * 6.2831855;
  if (fVar4 < 0.0) {
    auVar10._0_4_ = sqrtf(fVar4);
    auVar10._4_60_ = extraout_var_00;
    auVar8 = auVar10._0_16_;
  }
  else {
    auVar8 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  }
  auVar13 = ZEXT816(0) << 0x40;
  fVar2 = ((fVar2 * fVar2) / (fVar3 * (fVar3 + fVar3))) * -1.442695;
  auVar11 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  fVar2 = fVar2 - auVar11._0_4_;
  auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3da00ac9),0),ZEXT416((uint)fVar2),ZEXT416(0x3e679a0b));
  auVar6 = vfmadd213ss_fma(auVar6,ZEXT416((uint)fVar2),ZEXT416(0x3f321004));
  auVar6 = vfmadd213ss_fma(auVar6,ZEXT416((uint)fVar2),ZEXT416(0x3f800000));
  iVar1 = (int)auVar11._0_4_ + -0x7f + (auVar6._0_4_ >> 0x17);
  if (-0x7f < iVar1) {
    if (iVar1 < 0x80) {
      auVar13 = ZEXT416(iVar1 * 0x800000 + 0x3f800000U | auVar6._0_4_ & 0x807fffff);
    }
    else {
      auVar13 = SUB6416(ZEXT464(0x7f800000),0);
    }
  }
  auVar12 = vinsertps_avx(auVar12,auVar13,0x10);
  auVar7 = vinsertps_avx(auVar7,auVar8,0x10);
  auVar11._8_4_ = 0x3f800000;
  auVar11._0_8_ = 0x3f8000003f800000;
  auVar11._12_4_ = 0x3f800000;
  auVar7 = vdivps_avx(auVar11,auVar7);
  auVar8._0_4_ = auVar7._0_4_ * auVar12._0_4_;
  auVar8._4_4_ = auVar7._4_4_ * auVar12._4_4_;
  auVar8._8_4_ = auVar7._8_4_ * auVar12._8_4_;
  auVar8._12_4_ = auVar7._12_4_ * auVar12._12_4_;
  auVar7 = vinsertps_avx(auVar5,ZEXT416((uint)this->expY),0x10);
  auVar7 = vsubps_avx(auVar8,auVar7);
  auVar7 = vmaxps_avx(auVar7,ZEXT816(0) << 0x20);
  auVar5 = vmovshdup_avx(auVar7);
  return auVar7._0_4_ * auVar5._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(const Point2f &p) const {
        return (std::max<Float>(0, Gaussian(p.x, 0, sigma) - expX) *
                std::max<Float>(0, Gaussian(p.y, 0, sigma) - expY));
    }